

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O2

bool __thiscall QEvdevTabletHandler::queryLimits(QEvdevTabletHandler *this)

{
  QEvdevTabletData *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined8 uVar8;
  storage_type *psVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  char name [128];
  QArrayDataPointer<char16_t> local_f8;
  char *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  char local_b8 [4];
  undefined1 *puStack_b4;
  undefined1 *puStack_ac;
  undefined4 uStack_a4;
  char *pcStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  uVar5 = ioctl(this->m_fd,0x80184540);
  if (-1 < (int)uVar5) {
    pQVar1 = this->d;
    (pQVar1->minValues).x = local_d8._4_4_;
    (pQVar1->maxValues).x = (int)uStack_d0;
    QtPrivateLogging::qLcEvdevTablet();
    if (((byte)QtPrivateLogging::qLcEvdevTablet::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) != 0) {
      local_b8[0] = '\x02';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      uStack_a4 = 0;
      puStack_b4 = (undefined1 *)0x0;
      puStack_ac = (undefined1 *)0x0;
      pcStack_a0 = QtPrivateLogging::qLcEvdevTablet::category.name;
      uVar8 = QString::utf16();
      QMessageLogger::debug
                (local_b8,"evdevtablet: %ls: min X: %d max X: %d",uVar8,
                 (ulong)(uint)(this->d->minValues).x,(ulong)(uint)(this->d->maxValues).x);
    }
  }
  uVar6 = ioctl(this->m_fd,0x80184541,&local_d8);
  if (-1 < (int)(uVar6 | uVar5)) {
    pQVar1 = this->d;
    (pQVar1->minValues).y = local_d8._4_4_;
    (pQVar1->maxValues).y = (int)uStack_d0;
    QtPrivateLogging::qLcEvdevTablet();
    if (((byte)QtPrivateLogging::qLcEvdevTablet::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) != 0) {
      local_b8[0] = '\x02';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      uStack_a4 = 0;
      puStack_b4 = (undefined1 *)0x0;
      puStack_ac = (undefined1 *)0x0;
      pcStack_a0 = QtPrivateLogging::qLcEvdevTablet::category.name;
      uVar8 = QString::utf16();
      QMessageLogger::debug
                (local_b8,"evdevtablet: %ls: min Y: %d max Y: %d",uVar8,
                 (ulong)(uint)(this->d->minValues).y,(ulong)(uint)(this->d->maxValues).y);
    }
  }
  iVar7 = ioctl(this->m_fd,0x80184558,&local_d8);
  if (-1 < iVar7) {
    pQVar1 = this->d;
    (pQVar1->minValues).p = local_d8._4_4_;
    (pQVar1->maxValues).p = (int)uStack_d0;
    QtPrivateLogging::qLcEvdevTablet();
    if (((byte)QtPrivateLogging::qLcEvdevTablet::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) != 0) {
      local_b8[0] = '\x02';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      uStack_a4 = 0;
      puStack_b4 = (undefined1 *)0x0;
      puStack_ac = (undefined1 *)0x0;
      pcStack_a0 = QtPrivateLogging::qLcEvdevTablet::category.name;
      uVar8 = QString::utf16();
      QMessageLogger::debug
                (local_b8,"evdevtablet: %ls: min pressure: %d max pressure: %d",uVar8,
                 (ulong)(uint)(this->d->minValues).p,(ulong)(uint)(this->d->maxValues).p);
    }
  }
  iVar7 = ioctl(this->m_fd,0x80184559,&local_d8);
  if (-1 < iVar7) {
    pQVar1 = this->d;
    (pQVar1->minValues).d = local_d8._4_4_;
    (pQVar1->maxValues).d = (int)uStack_d0;
    QtPrivateLogging::qLcEvdevTablet();
    if (((byte)QtPrivateLogging::qLcEvdevTablet::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) != 0) {
      local_b8[0] = '\x02';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      uStack_a4 = 0;
      puStack_b4 = (undefined1 *)0x0;
      puStack_ac = (undefined1 *)0x0;
      pcStack_a0 = QtPrivateLogging::qLcEvdevTablet::category.name;
      uVar8 = QString::utf16();
      QMessageLogger::debug
                (local_b8,"evdevtablet: %ls: min distance: %d max distance: %d",uVar8,
                 (ulong)(uint)(this->d->minValues).d,(ulong)(uint)(this->d->maxValues).d);
    }
  }
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  local_78 = 0xaaaaaaaa;
  uStack_74 = 0xaaaaaaaa;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_7c = 0xaaaaaaaa;
  local_98 = 0xaaaaaaaa;
  uStack_94 = 0xaaaaaaaa;
  uStack_90 = 0xaaaaaaaa;
  uStack_8c = 0xaaaaaaaa;
  uStack_a4 = 0xaaaaaaaa;
  pcStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[0] = -0x56;
  local_b8[1] = -0x56;
  local_b8[2] = -0x56;
  local_b8[3] = -0x56;
  puStack_b4 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_ac = &DAT_aaaaaaaaaaaaaaaa;
  iVar7 = ioctl(this->m_fd,0x807f4506);
  if (-1 < iVar7) {
    psVar9 = (storage_type *)QByteArrayView::lengthHelperCharArray(local_b8,0x80);
    QVar10.m_data = psVar9;
    QVar10.m_size = (qsizetype)&local_f8;
    QString::fromLocal8Bit(QVar10);
    pQVar1 = this->d;
    pDVar3 = (pQVar1->devName).d.d;
    pcVar4 = (pQVar1->devName).d.ptr;
    (pQVar1->devName).d.d = (Data *)CONCAT44(local_f8.d._4_4_,local_f8.d._0_4_);
    (pQVar1->devName).d.ptr = (char16_t *)CONCAT44(local_f8.ptr._4_4_,local_f8.ptr._0_4_);
    local_f8.d._0_4_ = SUB84(pDVar3,0);
    local_f8.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
    local_f8.ptr._0_4_ = SUB84(pcVar4,0);
    local_f8.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
    qVar2 = (pQVar1->devName).d.size;
    (pQVar1->devName).d.size = CONCAT44(local_f8.size._4_4_,(undefined4)local_f8.size);
    local_f8.size._0_4_ = (undefined4)qVar2;
    local_f8.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    QtPrivateLogging::qLcEvdevTablet();
    if (((byte)QtPrivateLogging::qLcEvdevTablet::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) != 0) {
      local_f8.d._0_4_ = 2;
      local_f8.size._4_4_ = 0;
      local_f8.d._4_4_ = 0;
      local_f8.ptr._0_4_ = 0;
      local_f8.ptr._4_4_ = 0;
      local_f8.size._0_4_ = 0;
      local_e0 = QtPrivateLogging::qLcEvdevTablet::category.name;
      uVar8 = QString::utf16();
      QMessageLogger::debug((char *)&local_f8,"evdevtablet: %ls: device name: %s",uVar8,local_b8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return -1 < (int)(uVar6 | uVar5);
  }
  __stack_chk_fail();
}

Assistant:

bool QEvdevTabletHandler::queryLimits()
{
    bool ok = true;
    input_absinfo absInfo;
    memset(&absInfo, 0, sizeof(input_absinfo));
    ok &= ioctl(m_fd, EVIOCGABS(ABS_X), &absInfo) >= 0;
    if (ok) {
        d->minValues.x = absInfo.minimum;
        d->maxValues.x = absInfo.maximum;
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: min X: %d max X: %d", qUtf16Printable(m_device),
                d->minValues.x, d->maxValues.x);
    }
    ok &= ioctl(m_fd, EVIOCGABS(ABS_Y), &absInfo) >= 0;
    if (ok) {
        d->minValues.y = absInfo.minimum;
        d->maxValues.y = absInfo.maximum;
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: min Y: %d max Y: %d", qUtf16Printable(m_device),
                d->minValues.y, d->maxValues.y);
    }
    if (ioctl(m_fd, EVIOCGABS(ABS_PRESSURE), &absInfo) >= 0) {
        d->minValues.p = absInfo.minimum;
        d->maxValues.p = absInfo.maximum;
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: min pressure: %d max pressure: %d", qUtf16Printable(m_device),
                d->minValues.p, d->maxValues.p);
    }
    if (ioctl(m_fd, EVIOCGABS(ABS_DISTANCE), &absInfo) >= 0) {
        d->minValues.d = absInfo.minimum;
        d->maxValues.d = absInfo.maximum;
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: min distance: %d max distance: %d", qUtf16Printable(m_device),
                d->minValues.d, d->maxValues.d);
    }
    char name[128];
    if (ioctl(m_fd, EVIOCGNAME(sizeof(name) - 1), name) >= 0) {
        d->devName = QString::fromLocal8Bit(name);
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: device name: %s", qUtf16Printable(m_device), name);
    }
    return ok;
}